

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O2

void __thiscall Fl_Table_Type::add_child(Fl_Table_Type *this,Fl_Type *cc,Fl_Type *before)

{
  Fl_Table *this_00;
  Fl_Type *w2;
  
  if (before == (Fl_Type *)0x0) {
    w2 = (Fl_Type *)0x0;
  }
  else {
    w2 = before[1].prev;
  }
  this_00 = (Fl_Table *)(this->super_Fl_Group_Type).super_Fl_Widget_Type.o;
  if ((this_00->table->super_Fl_Group).children_ == 3) {
    fl_message(
              "Inserting child widgets into an Fl_Table is not recommended.\nPlease refer to the documentation on Fl_Table."
              );
    this_00 = (Fl_Table *)(this->super_Fl_Group_Type).super_Fl_Widget_Type.o;
  }
  Fl_Table::insert(this_00,(Fl_Widget *)cc[1].prev,(Fl_Widget *)w2);
  Fl_Widget::redraw((this->super_Fl_Group_Type).super_Fl_Widget_Type.o);
  return;
}

Assistant:

void Fl_Table_Type::add_child(Fl_Type* cc, Fl_Type* before) {
  Fl_Widget_Type* c = (Fl_Widget_Type*)cc;
  Fl_Widget* b = before ? ((Fl_Widget_Type*)before)->o : 0;
  if (((Fl_Table*)o)->children()==1) { // the FLuid_Table has one extra child
    fl_message("Inserting child widgets into an Fl_Table is not recommended.\n"
               "Please refer to the documentation on Fl_Table.");
  }
  ((Fl_Table*)o)->insert(*(c->o), b);
  o->redraw();
}